

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O1

re_t re_compile(char *pattern)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  
  bVar10 = *pattern;
  uVar3 = 0;
  if (bVar10 != 0) {
    iVar7 = 1;
    lVar4 = 0;
    uVar9 = 0;
    uVar6 = 1;
    do {
      uVar3 = uVar6;
      uVar8 = (uint)uVar9;
      if (bVar10 < 0x3f) {
        if (bVar10 < 0x2b) {
          if (bVar10 == 0x24) {
            re_compile::re_compiled[lVar4].type = '\x03';
          }
          else if (bVar10 == 0x2a) {
            re_compile::re_compiled[lVar4].type = '\x05';
          }
          else {
LAB_0011550c:
            re_compile::re_compiled[lVar4].type = '\a';
            re_compile::re_compiled[lVar4].field_1.ch = bVar10;
          }
        }
        else if (bVar10 == 0x2b) {
          re_compile::re_compiled[lVar4].type = '\x06';
        }
        else {
          if (bVar10 != 0x2e) goto LAB_0011550c;
          re_compile::re_compiled[lVar4].type = '\x01';
        }
      }
      else if (bVar10 < 0x5c) {
        if (bVar10 == 0x3f) {
          re_compile::re_compiled[lVar4].type = '\x04';
        }
        else {
          if (bVar10 != 0x5b) goto LAB_0011550c;
          uVar6 = (long)(int)uVar8 + 1;
          if (pattern[(long)(int)uVar8 + 1] != '^') {
            uVar6 = uVar9;
          }
          uVar6 = uVar6 & 0xffffffff;
          re_compile::re_compiled[lVar4].type = pattern[(long)(int)uVar8 + 1] == '^' | 8;
          iVar11 = iVar7;
LAB_001153fb:
          iVar5 = (int)uVar6;
          cVar1 = pattern[(long)iVar5 + 1];
          uVar8 = iVar5 + 1;
          if (cVar1 == '\\') {
            if (0x26 < iVar11) goto LAB_00115528;
            uVar8 = iVar5 + 2;
            lVar12 = (long)iVar11;
            iVar11 = iVar11 + 1;
            re_compile::ccl_buf[lVar12] = '\\';
LAB_00115445:
            lVar12 = (long)iVar11;
            iVar11 = iVar11 + 1;
            re_compile::ccl_buf[lVar12] = pattern[(int)uVar8];
            uVar6 = (ulong)uVar8;
            goto LAB_001153fb;
          }
          if ((cVar1 != '\0') && (cVar1 != ']')) {
            if (0x27 < iVar11) goto LAB_00115528;
            goto LAB_00115445;
          }
          if (iVar11 < 0x28) {
            re_compile::ccl_buf[iVar11] = '\0';
            re_compile::re_compiled[lVar4].field_1.ccl = re_compile::ccl_buf + iVar7;
            bVar2 = true;
            iVar7 = iVar11 + 1;
            goto LAB_00115586;
          }
LAB_00115528:
          bVar2 = false;
          iVar7 = iVar11;
LAB_00115586:
          if (!bVar2) {
            return (re_t)0x0;
          }
        }
      }
      else if (bVar10 == 0x5c) {
        bVar10 = pattern[(long)(int)uVar8 + 1];
        lVar12 = (long)(int)uVar8 + 1;
        if (bVar10 < 0x57) {
          if (bVar10 == 0) goto LAB_001155d2;
          if (bVar10 == 0x44) {
            re_compile::re_compiled[lVar4].type = '\v';
          }
          else {
            if (bVar10 != 0x53) goto LAB_00115590;
            re_compile::re_compiled[lVar4].type = '\x0f';
          }
        }
        else if (bVar10 < 0x73) {
          if (bVar10 == 0x57) {
            re_compile::re_compiled[lVar4].type = '\r';
          }
          else if (bVar10 == 100) {
            re_compile::re_compiled[lVar4].type = '\n';
          }
          else {
LAB_00115590:
            re_compile::re_compiled[lVar4].type = '\a';
            re_compile::re_compiled[lVar4].field_1.ch = pattern[lVar12];
          }
        }
        else if (bVar10 == 0x73) {
          re_compile::re_compiled[lVar4].type = '\x0e';
        }
        else {
          if (bVar10 != 0x77) goto LAB_00115590;
          re_compile::re_compiled[lVar4].type = '\f';
        }
        uVar8 = (uint)lVar12;
      }
      else {
        if (bVar10 != 0x5e) goto LAB_0011550c;
        re_compile::re_compiled[lVar4].type = '\x02';
      }
LAB_001155d2:
      bVar10 = pattern[(long)(int)uVar8 + 1];
      if (bVar10 == 0) break;
      uVar9 = (long)(int)uVar8 + 1;
      lVar4 = lVar4 + 1;
      uVar6 = uVar3 + 1;
    } while (uVar3 < 0x1d);
    uVar3 = uVar3 & 0xffffffff;
  }
  re_compile::re_compiled[uVar3].type = '\0';
  return re_compile::re_compiled;
}

Assistant:

re_t re_compile(const char* pattern)
{
  /* The sizes of the two static arrays below substantiates the static RAM usage of this module.
     MAX_REGEXP_OBJECTS is the max number of symbols in the expression.
     MAX_CHAR_CLASS_LEN determines the size of buffer for chars in all char-classes in the expression. */
  static regex_t re_compiled[MAX_REGEXP_OBJECTS];
  static unsigned char ccl_buf[MAX_CHAR_CLASS_LEN];
  int ccl_bufidx = 1;

  char c;     /* current char in pattern   */
  int i = 0;  /* index into pattern        */
  int j = 0;  /* index into re_compiled    */

  while (pattern[i] != '\0' && (j+1 < MAX_REGEXP_OBJECTS))
  {
    c = pattern[i];

    switch (c)
    {
      /* Meta-characters: */
      case '^': {    re_compiled[j].type = BEGIN;           } break;
      case '$': {    re_compiled[j].type = END;             } break;
      case '.': {    re_compiled[j].type = DOT;             } break;
      case '*': {    re_compiled[j].type = STAR;            } break;
      case '+': {    re_compiled[j].type = PLUS;            } break;
      case '?': {    re_compiled[j].type = QUESTIONMARK;    } break;
/*    case '|': {    re_compiled[j].type = BRANCH;          } break; <-- not working properly */

      /* Escaped character-classes (\s \w ...): */
      case '\\':
      {
        if (pattern[i+1] != '\0')
        {
          /* Skip the escape-char '\\' */
          i += 1;
          /* ... and check the next */
          switch (pattern[i])
          {
            /* Meta-character: */
            case 'd': {    re_compiled[j].type = DIGIT;            } break;
            case 'D': {    re_compiled[j].type = NOT_DIGIT;        } break;
            case 'w': {    re_compiled[j].type = ALPHA;            } break;
            case 'W': {    re_compiled[j].type = NOT_ALPHA;        } break;
            case 's': {    re_compiled[j].type = WHITESPACE;       } break;
            case 'S': {    re_compiled[j].type = NOT_WHITESPACE;   } break;

            /* Escaped character, e.g. '.' or '$' */ 
            default:  
            {
              re_compiled[j].type = CHAR;
              re_compiled[j].ch = pattern[i];
            } break;
          }
        }
        /* '\\' as last char in pattern -> invalid regular expression. */
/*
        else
        { 
          re_compiled[j].type = CHAR;
          re_compiled[j].ch = pattern[i];
        }
*/
      } break;

      /* Character class: */
      case '[':
      {
        /* Remember where the char-buffer starts. */
        int buf_begin = ccl_bufidx;

        /* Look-ahead to determine if negated */
        if (pattern[i+1] == '^')
        {
          re_compiled[j].type = INV_CHAR_CLASS;
          i += 1; /* Increment i to avoid including '^' in the char-buffer */
        }  
        else
        {
          re_compiled[j].type = CHAR_CLASS;
        }

        /* Copy characters inside [..] to buffer */
        while (    (pattern[++i] != ']')
                && (pattern[i]   != '\0')) /* Missing ] */
        {
          if (pattern[i] == '\\')
          {
            if (ccl_bufidx >= MAX_CHAR_CLASS_LEN - 1)
            {
              //fputs("exceeded internal buffer!\n", stderr);
              return 0;
            }
            ccl_buf[ccl_bufidx++] = pattern[i++];
          }
          else if (ccl_bufidx >= MAX_CHAR_CLASS_LEN)
          {
              //fputs("exceeded internal buffer!\n", stderr);
              return 0;
          }
          ccl_buf[ccl_bufidx++] = pattern[i];
        }
        if (ccl_bufidx >= MAX_CHAR_CLASS_LEN)
        {
            /* Catches cases such as [00000000000000000000000000000000000000][ */
            //fputs("exceeded internal buffer!\n", stderr);
            return 0;
        }
        /* Null-terminate string end */
        ccl_buf[ccl_bufidx++] = 0;
        re_compiled[j].ccl = &ccl_buf[buf_begin];
      } break;

      /* Other characters: */
      default:
      {
        re_compiled[j].type = CHAR;
        re_compiled[j].ch = c;
      } break;
    }
    i += 1;
    j += 1;
  }
  /* 'UNUSED' is a sentinel used to indicate end-of-pattern */
  re_compiled[j].type = UNUSED;

  return (re_t) re_compiled;
}